

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# de.cpp
# Opt level: O0

string * de_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  allocator<char> local_75 [20];
  allocator<char> local_61;
  char *local_60;
  char *desktop_session;
  char *var;
  const_iterator __end1;
  const_iterator __begin1;
  array<const_char_*,_5UL> *__range1;
  array<const_char_*,_5UL> env_vars;
  
  memcpy(&__range1,&PTR_anon_var_dwarf_54488_0018ba60,0x28);
  __begin1 = (const_iterator)&__range1;
  __end1 = std::array<const_char_*,_5UL>::begin((array<const_char_*,_5UL> *)__begin1);
  var = (char *)std::array<const_char_*,_5UL>::end((array<const_char_*,_5UL> *)__begin1);
  while( true ) {
    if (__end1 == (const_iterator)var) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"Unknown",local_75);
      std::allocator<char>::~allocator(local_75);
      return in_RDI;
    }
    desktop_session = *__end1;
    __s = getenv(desktop_session);
    if (__s != (char *)0x0) break;
    __end1 = __end1 + 1;
    local_60 = (char *)0x0;
  }
  local_60 = __s;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,&local_61);
  std::allocator<char>::~allocator(&local_61);
  return in_RDI;
}

Assistant:

std::string de() {
  constexpr std::array<const char*, 5> env_vars = {
    "XDG_CURRENT_DESKTOP",
    "DESKTOP_SESSION",
    "XDG_SESSION_DESKTOP",
    "CURRENT_DESKTOP",
    "SESSION_DESKTOP"
  };

  for (const char* var : env_vars) {
    if (const char *desktop_session = std::getenv(var)) {
      return std::string(desktop_session);
    }
  }

  return "Unknown";
}